

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_xor(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  undefined8 local_20;
  lua_Unsigned r;
  int n;
  int i;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  local_20 = 0;
  for (r._4_4_ = 1; r._4_4_ <= iVar1; r._4_4_ = r._4_4_ + 1) {
    uVar2 = luaL_checkinteger(L,r._4_4_);
    local_20 = uVar2 ^ local_20;
  }
  lua_pushinteger(L,local_20 & 0xffffffff);
  return 1;
}

Assistant:

static int b_xor (lua_State *L) {
  int i, n = lua_gettop(L);
  lua_Unsigned r = 0;
  for (i = 1; i <= n; i++)
    r ^= checkunsigned(L, i);
  pushunsigned(L, trim(r));
  return 1;
}